

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_main.cpp
# Opt level: O3

void printHelp(BenchFuction test)

{
  long lVar1;
  char *pcVar2;
  
  if (test == bench_loadneeded) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nusage: ./benchmark loadneeded <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps> <acc> <gpu> <extra>\n\n"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"dims  : number of dimensions\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"outs  : number of outputs\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"depth : grid density\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "type  : level, iptotal, etc.; ignored if not used by the grid\n",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n",0x4c)
    ;
    pcVar2 = "order : -1, 0, 1, 2; ignored if not used by the grid\n";
    lVar1 = 0x35;
LAB_00108a8c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"iters : number of times to repeat the function call\n",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"jumps : how many times to double <outs>\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n",0x40);
    pcVar2 = "gpu   : cuda device ID; ignored for cpu acceleration\n";
    lVar1 = 0x35;
LAB_00108adc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
    pcVar2 = 
    "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
    lVar1 = 0x5b;
LAB_00108af0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
    pcVar2 = "      : anisotropic weights come first (if used by the grid), then level limits\n";
    lVar1 = 0x50;
  }
  else {
    if (test == bench_make) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\nusage: ./benchmark makegrid <grid> <dims> <depth> <type> <rule> <iters> <jumps> <aniso>\n\n"
                 ,0x5a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"dims  : number of dimensions\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"depth : grid density\n",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "type  : level, iptotal, etc.; ignored if not used by the grid\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n",
                 0x4c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"iters : number of times to repeat the function call\n",0x34)
      ;
      pcVar2 = "jumps : how many times to increment <depth> by 1\n";
      lVar1 = 0x31;
LAB_00108910:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
      pcVar2 = "aniso : (optional) list of anisotropic weights and level limits\n";
LAB_0010891f:
      lVar1 = 0x40;
      goto LAB_00108af0;
    }
    if (test != bench_none) {
      if (test - bench_evaluate < 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "\nusage: ./benchmark evaluate <grid> <dims> <outs> <depth> <type> <rule> <order> <batch> <iters> <jumps> <acc> <gpu> <extra>\n\n"
                   ,0x7d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"dims  : number of dimensions\n",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"outs  : number of outputs\n",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"depth : grid density\n",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "type  : level, iptotal, etc.; ignored if not used by the grid\n",0x3e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n",
                   0x4c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"order : -1, 0, 1, 2; ignored if not used by the grid\n",
                   0x35);
        pcVar2 = "batch : number of points to use for the evaluate command\n";
        lVar1 = 0x39;
        goto LAB_00108a8c;
      }
      if (test == bench_refine) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "\nusage: ./benchmark refine <grid> <dims> <outs> <depth> <type> <rule> <order> <ref-type-depth> <min-growth> <surp-tolerance> <surp-criteria> <output> <iters> <acc> <gpu> <extra>\n\n"
                   ,0xb3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"dims  : number of dimensions\n",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"outs  : number of outputs\n",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"depth : grid density\n",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "type  : level, iptotal, etc.; ignored if not used by the grid\n",0x3e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n",
                   0x4c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"order : -1, 0, 1, 2; ignored if not used by the grid\n\n",
                   0x36);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ref-type-depth : (anisotropic refinement) refinement type, e.g., iptotal, ipcurved\n"
                   ,0x53);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "min-growth     : (anisotropic refinement) minumum number of refinement points, use 0 to switch to surplus refinement\n"
                   ,0x75);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"surp-tolerance : (surplus refinement) tolerance\n",0x30);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "surp-criteria  : (surplus refinement) selection criteria, e.g., stable, fds\n",
                   0x4c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "output         : (all refinement) output to use in the refinement\n\n",0x43);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"iters : number of times to repeat the function call\n",
                   0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n",0x40);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"gpu   : cuda device ID; ignored for cpu acceleration\n",
                   0x35);
        pcVar2 = "extra : (optional) list of anisotropic weights and level limits\n";
        goto LAB_0010891f;
      }
      if (test == bench_iweights) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "\nusage: ./benchmark iweights <grid> <dims> <depth> <type> <rule> <order> <iters> <jumps> <aniso>\n\n"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"dims  : number of dimensions\n",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"depth : grid density\n",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "type  : level, iptotal, etc.; ignored if not used by the grid\n",0x3e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and Fourier grids\n",
                   0x4c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"order : -1, 0, 1, 2; ignored if not used by the grid\n",
                   0x35);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"iters : number of times to repeat the function call\n",
                   0x34);
        pcVar2 = "jumps : how many times to increase <depth> by 1\n";
        lVar1 = 0x30;
        goto LAB_00108910;
      }
      if (test != bench_differentiate) goto LAB_00108b0c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\nusage: ./benchmark differentiate <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps>\n\n"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"grid  : global, sequence, localp, wavelet, fourier\n",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"dims  : number of dimensions\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"outs  : number of outputs\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"depth : grid density\n",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "type  : level, iptotal, etc.; ignored if not used by the grid\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n",
                 0x4c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"order : -1, 0, 1, 2; ignored if not used by the grid\n",0x35
                );
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"iters : number of times to repeat the function call\n",0x34)
      ;
      pcVar2 = "jumps : how many times to double <outs>\n";
      lVar1 = 0x28;
      goto LAB_00108adc;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nusage: ./benchmark <function> <parameters>\n\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "functions: makegrid, loadneeded, evaluate(-mixed), differentiate, iweights, refine\n"
               ,0x53);
    pcVar2 = "\n see: ./benchmark <function> help\n";
    lVar1 = 0x23;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
LAB_00108b0c:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return;
}

Assistant:

void printHelp(BenchFuction test){
    if (test == bench_none){
        cout << "\nusage: ./benchmark <function> <parameters>\n\n";
        cout << "functions: makegrid, loadneeded, evaluate(-mixed), differentiate, iweights, refine\n";
        cout << "\n see: ./benchmark <function> help\n";
    }else if (test == bench_make){
        cout << "\nusage: ./benchmark makegrid <grid> <dims> <depth> <type> <rule> <iters> <jumps> <aniso>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to increment <depth> by 1\n";
        cout << "aniso : (optional) list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_loadneeded){
        cout << "\nusage: ./benchmark loadneeded <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps> <acc> <gpu> <extra>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to double <outs>\n";
        cout << "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        cout << "gpu   : cuda device ID; ignored for cpu acceleration\n";
        cout << "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_evaluate || test == bench_evaluate_mixed){
        cout << "\nusage: ./benchmark evaluate <grid> <dims> <outs> <depth> <type> <rule> <order> <batch> <iters> <jumps> <acc> <gpu> <extra>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "batch : number of points to use for the evaluate command\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to double <outs>\n";
        cout << "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        cout << "gpu   : cuda device ID; ignored for cpu acceleration\n";
        cout << "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_differentiate){
        cout << "\nusage: ./benchmark differentiate <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to double <outs>\n";
        cout << "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_iweights){
        cout << "\nusage: ./benchmark iweights <grid> <dims> <depth> <type> <rule> <order> <iters> <jumps> <aniso>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and Fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to increase <depth> by 1\n";
        cout << "aniso : (optional) list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_refine){
        cout << "\nusage: ./benchmark refine <grid> <dims> <outs> <depth> <type> <rule> <order> <ref-type-depth> <min-growth> <surp-tolerance> <surp-criteria> <output> <iters> <acc> <gpu> <extra>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n\n";

        cout << "ref-type-depth : (anisotropic refinement) refinement type, e.g., iptotal, ipcurved\n";
        cout << "min-growth     : (anisotropic refinement) minumum number of refinement points, use 0 to switch to surplus refinement\n";
        cout << "surp-tolerance : (surplus refinement) tolerance\n";
        cout << "surp-criteria  : (surplus refinement) selection criteria, e.g., stable, fds\n";
        cout << "output         : (all refinement) output to use in the refinement\n\n";

        cout << "iters : number of times to repeat the function call\n";
        cout << "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        cout << "gpu   : cuda device ID; ignored for cpu acceleration\n";
        cout << "extra : (optional) list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }
    cout << endl;
}